

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GaussianEdgeCalculator.cpp
# Opt level: O1

void __thiscall
GaussianEdgeCalculator::GaussianEdgeCalculator
          (GaussianEdgeCalculator *this,double significance_level,double insert_size_mean,
          double insert_size_stddev)

{
  double dVar1;
  type tVar2;
  double *pdVar3;
  double dVar4;
  size_t x;
  long lVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  double local_70;
  normal_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  *local_68;
  complemented2_type<boost::math::normal_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>,_double>
  local_60;
  double local_50;
  normal_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  local_48;
  
  (this->super_EdgeCalculator)._vptr_EdgeCalculator =
       (_func_int **)&PTR__GaussianEdgeCalculator_001b8e88;
  this->significance_level = significance_level;
  this->insert_size_popmean = insert_size_mean;
  this->insert_size_popstddev = insert_size_stddev;
  local_68 = (normal_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
              *)insert_size_stddev;
  local_50 = significance_level;
  pdVar3 = (double *)operator_new__(0x4b320);
  this->cached_survival_function = pdVar3;
  local_48.m_mean._0_4_ = 0;
  local_48.m_mean._4_4_ = 0;
  local_48.m_sd._0_4_ = 0;
  local_48.m_sd._4_4_ = 0x3ff00000;
  lVar5 = 0;
  do {
    local_70 = (double)lVar5 * 0.001;
    local_60.dist = &local_48;
    local_60.param = &local_70;
    dVar1 = boost::math::
            cdf<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                      (&local_60);
    this->cached_survival_function[lVar5] = dVar1;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x9664);
  local_68 = (normal_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
              *)((double)local_68 * 1.4142135623730951);
  bVar6 = (uint)((ulong)((long)ABS((double)local_68) + -0x10000000000000) >> 0x35) < 0x3ff;
  bVar8 = -1 < (long)local_68;
  bVar7 = (undefined1 *)0xffffffffffffe < (undefined1 *)((long)&local_68[-1].m_sd + 7U);
  if (bVar7 && (!bVar8 || !bVar6)) {
    local_60.dist = local_68;
    boost::math::policies::detail::raise_error<std::domain_error,double>
              (boost::math::
               normal_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
               ::normal_distribution::function,"Scale parameter is %1%, but must be > 0 !",
               (double *)&local_60);
  }
  local_70 = local_50 * 0.5;
  local_60.dist = local_68;
  uVar9 = 0;
  if (bVar7 && (!bVar8 || !bVar6)) {
    boost::math::policies::detail::raise_error<std::domain_error,double>
              (boost::math::
               quantile<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>(boost::math::normal_distribution<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>const&,double_const&)
               ::function,"Scale parameter is %1%, but must be > 0 !",(double *)&local_60);
    uVar9 = 0x7ff80000;
  }
  dVar1 = (double)((ulong)uVar9 << 0x20);
  if (!bVar7 || bVar8 && bVar6) {
    bVar6 = local_70 <= 1.0;
    bVar7 = 0.0 <= local_70;
    dVar4 = ABS(local_70);
    if (0x7fefffffffffffff < (ulong)dVar4 || (!bVar6 || !bVar7)) {
      boost::math::policies::detail::raise_error<std::domain_error,double>
                (boost::math::
                 quantile<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>(boost::math::normal_distribution<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>const&,double_const&)
                 ::function,"Probability argument is %1%, but must be >= 0 and <= 1 !",&local_70);
      uVar9 = 0x7ff80000;
    }
    dVar1 = (double)((ulong)uVar9 << 0x20);
    if (0x7fefffffffffffff >= (ulong)dVar4 && (bVar6 && bVar7)) {
      tVar2 = boost::math::
              erfc_inv<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                        (local_70 + local_70,
                         (policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                          *)&local_60);
      dVar1 = (double)local_68 * -1.4142135623730951 * tVar2 + 0.0;
    }
  }
  dVar1 = floor(-dVar1);
  this->allowable_insert_size_diff = (int)dVar1;
  return;
}

Assistant:

GaussianEdgeCalculator::GaussianEdgeCalculator(double significance_level, double insert_size_mean, double insert_size_stddev) {
	this->significance_level = significance_level;
	this->insert_size_popmean = insert_size_mean;
	this->insert_size_popstddev = insert_size_stddev;
	cached_survival_function = new double[SF_CACHE_SIZE];
	boost::math::normal norm;
	for (size_t x=0; x<SF_CACHE_SIZE; ++x) {
		cached_survival_function[x] = boost::math::cdf(boost::math::complement(norm,x*SF_CACHE_FACTOR));
	}
	boost::math::normal norm2(0,sqrt2*insert_size_stddev);
	this->allowable_insert_size_diff = (int)floor(-boost::math::quantile(norm2, significance_level/2.0));
	// cout << "allowable insert size difference: " << allowable_insert_size_diff << endl;
}